

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProString::endsWith(ProString *this,ProString *sub,CaseSensitivity cs)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView s;
  QStringView local_48;
  QStringView local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_data = (this->m_string).d.ptr;
  local_38.m_size = (this->m_string).d.size;
  local_48 = QStringView::mid(&local_38,(long)this->m_offset,(long)this->m_length);
  local_38.m_data = (sub->m_string).d.ptr;
  local_38.m_size = (sub->m_string).d.size;
  s = QStringView::mid(&local_38,(long)sub->m_offset,(long)sub->m_length);
  bVar1 = QStringView::endsWith(&local_48,s,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const ProString &sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().endsWith(sub.toQStringView(), cs); }